

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O2

void Assimp::ExportSceneSTL
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  bool exportPointClouds;
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar3;
  DeadlyImportError *pDVar4;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  STLExporter exporter;
  long *plVar2;
  
  exportPointClouds = ExportProperties::GetPropertyBool(pProperties,"EXPORT_POINT_CLOUDS",false);
  STLExporter::STLExporter(&exporter,pFile,pScene,exportPointClouds,false);
  if (((&exporter.field_0x20)[*(long *)(exporter._0_8_ + -0x18)] & 5) != 0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pFile,&local_221);
    std::operator+(&local_220,"output data creation failed. Most likely the file became too large: "
                   ,&local_200);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_220);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar3 = std::ostream::tellp();
    (**(code **)(*plVar2 + 0x18))(plVar2,local_220._M_dataplus._M_p,uVar3,1);
    std::__cxx11::string::~string((string *)&local_220);
    (**(code **)(*plVar2 + 8))(plVar2);
    STLExporter::~STLExporter(&exporter);
    return;
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pFile,&local_221);
  std::operator+(&local_220,"could not open output .stl file: ",&local_200);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_220);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneSTL(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties )
{
    bool exportPointClouds = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);

    // invoke the exporter
    STLExporter exporter(pFile, pScene, exportPointClouds );

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stl file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}